

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O0

void __thiscall clip_model_loader::load_hparams(clip_model_loader *this)

{
  undefined1 uVar1;
  bool bVar2;
  projector_type pVar3;
  int iVar4;
  ulong uVar5;
  runtime_error *this_00;
  undefined8 uVar6;
  pointer pgVar7;
  pointer pgVar8;
  long in_RDI;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  pair<std::__detail::_Node_iterator<int,_true,_false>,_bool> pVar11;
  int *layer;
  iterator __end2;
  iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  vector<int,_std::allocator<int>_> vision_feature_layer;
  int i;
  float *std_data;
  float *mean_data;
  int idx_std;
  int idx_mean;
  string mm_patch_merge_type;
  string proj_type;
  clip_hparams *hparams;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffaa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffab0;
  undefined4 in_stack_fffffffffffffab8;
  undefined4 in_stack_fffffffffffffabc;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>
  *in_stack_fffffffffffffac0;
  undefined7 in_stack_fffffffffffffac8;
  undefined1 in_stack_fffffffffffffacf;
  undefined7 in_stack_fffffffffffffae0;
  undefined1 in_stack_fffffffffffffae7;
  char *in_stack_fffffffffffffae8;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffaf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  string *in_stack_fffffffffffffaf8;
  string *key;
  clip_model_loader *in_stack_fffffffffffffb00;
  clip_model_loader *this_02;
  vector<int,_std::allocator<int>_> *output;
  string *key_00;
  clip_model_loader *this_03;
  undefined8 in_stack_fffffffffffffb28;
  undefined1 uVar12;
  char *fmt;
  string *in_stack_fffffffffffffb30;
  string *output_00;
  string *in_stack_fffffffffffffb38;
  string *key_01;
  clip_model_loader *in_stack_fffffffffffffb40;
  clip_model_loader *this_04;
  allocator<char> local_451;
  string local_450 [32];
  _Node_iterator_base<int,_false> local_430;
  undefined1 local_428;
  reference local_420;
  int *local_418;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_410;
  undefined1 *local_408;
  allocator<char> local_3f9;
  undefined1 local_3d8 [28];
  int local_3bc;
  long local_3b8;
  long local_3b0;
  int local_3a4;
  int local_3a0;
  allocator<char> local_399;
  string local_398 [32];
  string local_378 [39];
  undefined1 local_351 [40];
  undefined1 local_329 [40];
  undefined1 local_301 [40];
  allocator<char> local_2d9;
  string local_2d8 [32];
  vector<int,_std::allocator<int>_> local_2b8;
  string local_298;
  undefined1 local_278 [64];
  string local_238;
  string local_218;
  undefined1 local_1f1 [40];
  allocator<char> local_1c9;
  string local_1c8 [39];
  allocator<char> local_1a1;
  string local_1a0 [39];
  allocator<char> local_179;
  string local_178 [39];
  allocator<char> local_151;
  string local_150 [39];
  allocator<char> local_129;
  string local_128 [39];
  allocator<char> local_101;
  string local_100 [39];
  allocator<char> local_d9;
  string local_d8 [39];
  allocator<char> local_b1;
  string local_b0 [39];
  undefined1 local_89;
  string local_88 [40];
  undefined8 local_60;
  allocator<char> local_51;
  string local_50 [32];
  string local_30 [32];
  long local_10;
  
  uVar12 = (undefined1)((ulong)in_stack_fffffffffffffb28 >> 0x38);
  local_10 = *(long *)(in_RDI + 0x10) + 0x10;
  std::__cxx11::string::string(local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0));
  get_string(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,in_stack_fffffffffffffb30,
             (bool)uVar12);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator(&local_51);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    pVar3 = clip_projector_type_from_string
                      ((string *)CONCAT17(in_stack_fffffffffffffacf,in_stack_fffffffffffffac8));
    *(projector_type *)(*(long *)(in_RDI + 0x10) + 0x300) = pVar3;
  }
  if (*(int *)(*(long *)(in_RDI + 0x10) + 0x300) == 10) {
    local_89 = 1;
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    uVar6 = std::__cxx11::string::c_str();
    string_format_abi_cxx11_
              ((char *)local_88,"%s: unknown projector type: %s\n","load_hparams",uVar6);
    std::runtime_error::runtime_error(this_00,local_88);
    local_89 = 0;
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0));
  get_bool(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,(bool *)in_stack_fffffffffffffaf0,
           SUB81((ulong)in_stack_fffffffffffffae8 >> 0x38,0));
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator(&local_b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0));
  get_bool(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,(bool *)in_stack_fffffffffffffaf0,
           SUB81((ulong)in_stack_fffffffffffffae8 >> 0x38,0));
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator(&local_d9);
  if ((*(byte *)(*(long *)(in_RDI + 0x10) + 1) & 1) == 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/llava/clip.cpp"
               ,0x59d,"GGML_ASSERT(%s) failed","ctx_clip.has_vision_encoder");
    std::__cxx11::string::~string(local_30);
  }
  else {
    if ((**(byte **)(in_RDI + 0x10) & 1) != 0) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/llava/clip.cpp"
                 ,0x59e,"GGML_ASSERT(%s) failed","!ctx_clip.has_text_encoder");
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0));
    get_bool(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,(bool *)in_stack_fffffffffffffaf0,
             SUB81((ulong)in_stack_fffffffffffffae8 >> 0x38,0));
    std::__cxx11::string::~string(local_100);
    std::allocator<char>::~allocator(&local_101);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0));
    get_bool(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,(bool *)in_stack_fffffffffffffaf0,
             SUB81((ulong)in_stack_fffffffffffffae8 >> 0x38,0));
    std::__cxx11::string::~string(local_128);
    std::allocator<char>::~allocator(&local_129);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0));
    get_i32(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,(int *)in_stack_fffffffffffffaf0,
            SUB81((ulong)in_stack_fffffffffffffae8 >> 0x38,0));
    std::__cxx11::string::~string(local_150);
    std::allocator<char>::~allocator(&local_151);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0));
    get_bool(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,(bool *)in_stack_fffffffffffffaf0,
             SUB81((ulong)in_stack_fffffffffffffae8 >> 0x38,0));
    std::__cxx11::string::~string(local_178);
    std::allocator<char>::~allocator(&local_179);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0));
    get_bool(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,(bool *)in_stack_fffffffffffffaf0,
             SUB81((ulong)in_stack_fffffffffffffae8 >> 0x38,0));
    std::__cxx11::string::~string(local_1a0);
    std::allocator<char>::~allocator(&local_1a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0));
    get_bool(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,(bool *)in_stack_fffffffffffffaf0,
             SUB81((ulong)in_stack_fffffffffffffae8 >> 0x38,0));
    std::__cxx11::string::~string(local_1c8);
    std::allocator<char>::~allocator(&local_1c9);
    this_04 = (clip_model_loader *)local_1f1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0));
    get_bool(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,(bool *)in_stack_fffffffffffffaf0,
             SUB81((ulong)in_stack_fffffffffffffae8 >> 0x38,0));
    std::__cxx11::string::~string((string *)(local_1f1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_1f1);
    key_01 = &local_218;
    string_format_abi_cxx11_((char *)key_01,"clip.%s.embedding_length","vision");
    get_u32(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,(int *)in_stack_fffffffffffffaf0,
            SUB81((ulong)in_stack_fffffffffffffae8 >> 0x38,0));
    std::__cxx11::string::~string((string *)&local_218);
    output_00 = &local_238;
    string_format_abi_cxx11_((char *)output_00,"clip.%s.attention.head_count","vision");
    get_u32(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,(int *)in_stack_fffffffffffffaf0,
            SUB81((ulong)in_stack_fffffffffffffae8 >> 0x38,0));
    std::__cxx11::string::~string((string *)&local_238);
    fmt = local_278 + 0x20;
    string_format_abi_cxx11_(fmt,"clip.%s.feed_forward_length","vision");
    uVar1 = (undefined1)((ulong)fmt >> 0x38);
    get_u32(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,(int *)in_stack_fffffffffffffaf0,
            SUB81((ulong)in_stack_fffffffffffffae8 >> 0x38,0));
    std::__cxx11::string::~string((string *)(local_278 + 0x20));
    this_03 = (clip_model_loader *)local_278;
    string_format_abi_cxx11_((char *)this_03,"clip.%s.block_count","vision");
    get_u32(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,(int *)in_stack_fffffffffffffaf0,
            SUB81((ulong)in_stack_fffffffffffffae8 >> 0x38,0));
    std::__cxx11::string::~string((string *)local_278);
    key_00 = &local_298;
    string_format_abi_cxx11_((char *)key_00,"clip.%s.projection_dim","vision");
    get_u32(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,(int *)in_stack_fffffffffffffaf0,
            SUB81((ulong)in_stack_fffffffffffffae8 >> 0x38,0));
    std::__cxx11::string::~string((string *)&local_298);
    output = &local_2b8;
    string_format_abi_cxx11_((char *)output,"clip.%s.attention.layer_norm_epsilon","vision");
    get_f32(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,(float *)in_stack_fffffffffffffaf0,
            SUB81((ulong)in_stack_fffffffffffffae8 >> 0x38,0));
    std::__cxx11::string::~string((string *)&local_2b8);
    uVar12 = (undefined1)((ulong)&local_2d9 >> 0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0));
    get_u32(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,(int *)in_stack_fffffffffffffaf0,
            SUB81((ulong)in_stack_fffffffffffffae8 >> 0x38,0));
    std::__cxx11::string::~string(local_2d8);
    std::allocator<char>::~allocator(&local_2d9);
    this_02 = (clip_model_loader *)local_301;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0));
    get_u32(this_02,in_stack_fffffffffffffaf8,(int *)in_stack_fffffffffffffaf0,
            SUB81((ulong)in_stack_fffffffffffffae8 >> 0x38,0));
    std::__cxx11::string::~string((string *)(local_301 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_301);
    key = (string *)local_329;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0));
    get_u32(this_02,key,(int *)in_stack_fffffffffffffaf0,
            SUB81((ulong)in_stack_fffffffffffffae8 >> 0x38,0));
    std::__cxx11::string::~string((string *)(local_329 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_329);
    this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_351;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_01,in_stack_fffffffffffffae8,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0));
    get_arr_int(this_03,key_00,output,(bool)uVar12);
    std::__cxx11::string::~string((string *)(local_351 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_351);
    std::__cxx11::string::string(local_378);
    __s = &local_399;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_01,(char *)__s,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0));
    get_string(this_04,key_01,output_00,(bool)uVar1);
    std::__cxx11::string::~string(local_398);
    std::allocator<char>::~allocator(&local_399);
    uVar1 = std::operator==(in_stack_fffffffffffffab0,(char *)in_stack_fffffffffffffaa8);
    if ((bool)uVar1) {
      *(undefined4 *)(local_10 + 0x20) = 1;
    }
    std::__cxx11::string::~string(local_378);
    pgVar7 = std::unique_ptr<gguf_context,_gguf_context_deleter>::get
                       ((unique_ptr<gguf_context,_gguf_context_deleter> *)in_stack_fffffffffffffab0)
    ;
    local_3a0 = gguf_find_key(pgVar7,"clip.vision.image_mean");
    pgVar7 = std::unique_ptr<gguf_context,_gguf_context_deleter>::get
                       ((unique_ptr<gguf_context,_gguf_context_deleter> *)in_stack_fffffffffffffab0)
    ;
    local_3a4 = gguf_find_key(pgVar7,"clip.vision.image_std");
    if (-1 < local_3a0) {
      if (local_3a4 < 0) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/llava/clip.cpp"
                   ,0x5c2,"GGML_ASSERT(%s) failed","idx_std >= 0 && \"image_std not found\"");
      }
      pgVar7 = std::unique_ptr<gguf_context,_gguf_context_deleter>::get
                         ((unique_ptr<gguf_context,_gguf_context_deleter> *)
                          in_stack_fffffffffffffab0);
      local_3b0 = gguf_get_arr_data(pgVar7,(long)local_3a0);
      pgVar7 = std::unique_ptr<gguf_context,_gguf_context_deleter>::get
                         ((unique_ptr<gguf_context,_gguf_context_deleter> *)
                          in_stack_fffffffffffffab0);
      local_3b8 = gguf_get_arr_data(pgVar7,(long)local_3a4);
      for (local_3bc = 0; local_3bc < 3; local_3bc = local_3bc + 1) {
        *(undefined4 *)(*(long *)(in_RDI + 0x10) + 0x308 + (long)local_3bc * 4) =
             *(undefined4 *)(local_3b0 + (long)local_3bc * 4);
        *(undefined4 *)(*(long *)(in_RDI + 0x10) + 0x314 + (long)local_3bc * 4) =
             *(undefined4 *)(local_3b8 + (long)local_3bc * 4);
      }
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1be90c);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this_01,(char *)__s,(allocator<char> *)CONCAT17(uVar1,in_stack_fffffffffffffae0));
      get_arr_int(this_03,key_00,output,(bool)uVar12);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffc08);
      std::allocator<char>::~allocator(&local_3f9);
      local_408 = local_3d8;
      local_410._M_current =
           (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_fffffffffffffaa8);
      local_418 = (int *)std::vector<int,_std::allocator<int>_>::end(in_stack_fffffffffffffaa8);
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *
                                )in_stack_fffffffffffffab0,
                                (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *
                                )in_stack_fffffffffffffaa8), bVar2) {
        local_420 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                    operator*(&local_410);
        pVar11 = std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::
                 insert(in_stack_fffffffffffffac0,
                        (value_type *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8))
        ;
        local_430._M_cur = (__node_type *)pVar11.first.super__Node_iterator_base<int,_false>._M_cur;
        local_428 = pVar11.second;
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&local_410);
      }
      iVar4 = get_deepest_feature_layer((clip_ctx *)CONCAT17(uVar1,in_stack_fffffffffffffae0));
      *(int *)(*(long *)(in_RDI + 0x10) + 0x304) = iVar4;
      if ((int)g_logger_state.verbosity_thold < 3) {
        clip_log_internal(GGML_LOG_LEVEL_INFO,"%s: text_encoder:       %d\n","load_hparams",
                          (ulong)(**(byte **)(in_RDI + 0x10) & 1));
      }
      if ((int)g_logger_state.verbosity_thold < 3) {
        clip_log_internal(GGML_LOG_LEVEL_INFO,"%s: vision_encoder:     %d\n","load_hparams",
                          (ulong)(*(byte *)(*(long *)(in_RDI + 0x10) + 1) & 1));
      }
      if ((int)g_logger_state.verbosity_thold < 3) {
        clip_log_internal(GGML_LOG_LEVEL_INFO,"%s: llava_projector:    %d\n","load_hparams",
                          (ulong)(*(byte *)(*(long *)(in_RDI + 0x10) + 2) & 1));
      }
      if ((int)g_logger_state.verbosity_thold < 3) {
        clip_log_internal(GGML_LOG_LEVEL_INFO,"%s: minicpmv_projector: %d\n","load_hparams",
                          (ulong)(*(byte *)(*(long *)(in_RDI + 0x10) + 3) & 1));
      }
      if ((int)g_logger_state.verbosity_thold < 3) {
        clip_log_internal(GGML_LOG_LEVEL_INFO,"%s: minicpmv_version:   %d\n","load_hparams",
                          (ulong)*(uint *)(*(long *)(in_RDI + 0x10) + 8));
      }
      if ((int)g_logger_state.verbosity_thold < 3) {
        clip_log_internal(GGML_LOG_LEVEL_INFO,"%s: glm_projector:      %d\n","load_hparams",
                          (ulong)(*(byte *)(*(long *)(in_RDI + 0x10) + 4) & 1));
      }
      if ((int)g_logger_state.verbosity_thold < 3) {
        uVar6 = *(undefined8 *)(in_RDI + 0x38);
        auVar9._8_4_ = (int)((ulong)uVar6 >> 0x20);
        auVar9._0_8_ = uVar6;
        auVar9._12_4_ = 0x45300000;
        clip_log_internal((ggml_log_level)
                          (((auVar9._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0)) *
                           0.0009765625 * 0.0009765625),(char *)0x2,
                          "%s: model size:         %.2f MiB\n","load_hparams");
      }
      if ((int)g_logger_state.verbosity_thold < 3) {
        pgVar8 = std::unique_ptr<ggml_context,_ggml_context_deleter>::get
                           ((unique_ptr<ggml_context,_ggml_context_deleter> *)
                            in_stack_fffffffffffffab0);
        in_stack_fffffffffffffac0 =
             (unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
             ggml_get_mem_size(pgVar8);
        auVar10._8_4_ = (int)((ulong)in_stack_fffffffffffffac0 >> 0x20);
        auVar10._0_8_ = in_stack_fffffffffffffac0;
        auVar10._12_4_ = 0x45300000;
        clip_log_internal((ggml_log_level)
                          (((auVar10._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)in_stack_fffffffffffffac0) -
                           4503599627370496.0)) * 0.0009765625 * 0.0009765625),(char *)0x2,
                          "%s: metadata size:      %.2f MiB\n","load_hparams");
      }
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffac0);
      iVar4 = *(int *)(*(long *)(in_RDI + 0x10) + 0x300);
      if (iVar4 == 8) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (this_01,(char *)__s,(allocator<char> *)CONCAT17(uVar1,in_stack_fffffffffffffae0))
        ;
        get_u32(this_02,key,(int *)this_01,SUB81((ulong)__s >> 0x38,0));
        std::__cxx11::string::~string(local_450);
        std::allocator<char>::~allocator(&local_451);
      }
      else if (iVar4 == 9) {
        *(undefined4 *)(local_10 + 0x28) = 0x461c4000;
      }
      return;
    }
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/llava/clip.cpp"
               ,0x5c1,"GGML_ASSERT(%s) failed","idx_mean >= 0 && \"image_mean not found\"");
    std::__cxx11::string::~string(local_378);
  }
  _Unwind_Resume(local_60);
}

Assistant:

void load_hparams() {
        auto & hparams = ctx_clip.vision_model.hparams;

        // projector type
        {
            std::string proj_type;
            get_string(KEY_PROJ_TYPE, proj_type, false);
            if (!proj_type.empty()) {
                ctx_clip.proj_type = clip_projector_type_from_string(proj_type);
            }
            if (ctx_clip.proj_type == PROJECTOR_TYPE_UNKNOWN) {
                throw std::runtime_error(string_format("%s: unknown projector type: %s\n", __func__, proj_type.c_str()));
            }
        }

        // other hparams
        {
            get_bool(KEY_HAS_TEXT_ENC, ctx_clip.has_text_encoder, false);
            get_bool(KEY_HAS_VIS_ENC, ctx_clip.has_vision_encoder, false);
            GGML_ASSERT(ctx_clip.has_vision_encoder);
            GGML_ASSERT(!ctx_clip.has_text_encoder);

            // legacy keys, use KEY_PROJ_TYPE instead
            get_bool(KEY_HAS_LLAVA_PROJ, ctx_clip.has_llava_projector, false);
            get_bool(KEY_HAS_MINICPMV_PROJ, ctx_clip.has_minicpmv_projector, false);
            get_i32(KEY_MINICPMV_VERSION, ctx_clip.minicpmv_version, false);
            get_bool(KEY_HAS_GLM_PROJ, ctx_clip.has_glm_projector, false);
            get_bool(KEY_HAS_QWEN2VL_MERGER, ctx_clip.has_qwen2vl_merger, false);
            // !!! do NOT extend the list above, use KEY_PROJ_TYPE instead

            get_bool(KEY_USE_GELU, ctx_clip.use_gelu, false);
            get_bool(KEY_USE_SILU, ctx_clip.use_silu, false);

            get_u32(string_format(KEY_N_EMBD,         "vision"), hparams.hidden_size);
            get_u32(string_format(KEY_N_HEAD,         "vision"), hparams.n_head);
            get_u32(string_format(KEY_N_FF,           "vision"), hparams.n_intermediate);
            get_u32(string_format(KEY_N_BLOCK,        "vision"), hparams.n_layer);
            get_u32(string_format(KEY_PROJ_DIM,       "vision"), hparams.projection_dim);
            get_f32(string_format(KEY_LAYER_NORM_EPS, "vision"), hparams.eps);
            get_u32(KEY_IMAGE_SIZE, hparams.image_size);
            get_u32(KEY_PATCH_SIZE, hparams.patch_size);
            get_u32(KEY_IMAGE_CROP_RESOLUTION, hparams.image_crop_resolution, false);
            get_arr_int(KEY_IMAGE_GRID_PINPOINTS, hparams.image_grid_pinpoints, false);

            {
                std::string mm_patch_merge_type;
                get_string(KEY_MM_PATCH_MERGE_TYPE, mm_patch_merge_type, false);
                if (mm_patch_merge_type == "spatial_unpad") {
                    hparams.mm_patch_merge_type = PATCH_MERGE_SPATIAL_UNPAD;
                }
            }

            {
                int idx_mean = gguf_find_key(ctx_gguf.get(), KEY_IMAGE_MEAN);
                int idx_std  = gguf_find_key(ctx_gguf.get(), KEY_IMAGE_STD);
                GGML_ASSERT(idx_mean >= 0 && "image_mean not found");
                GGML_ASSERT(idx_std >= 0  && "image_std not found");
                const float * mean_data = (const float *) gguf_get_arr_data(ctx_gguf.get(), idx_mean);
                const float * std_data  = (const float *) gguf_get_arr_data(ctx_gguf.get(), idx_std);
                for (int i = 0; i < 3; ++i) {
                    ctx_clip.image_mean[i] = mean_data[i];
                    ctx_clip.image_std[i]  = std_data[i];
                }
            }

            // Load the vision feature layer indices if they are explicitly provided;
            // if multiple vision feature layers are present, the values will be concatenated
            // to form the final visual features.
            // NOTE: gguf conversions should standardize the values of the vision feature layer to
            // be non-negative, since we use -1 to mark values as unset here.
            std::vector<int> vision_feature_layer;
            get_arr_int(KEY_FEATURE_LAYER, vision_feature_layer, false);
            // convert std::vector to std::unordered_set
            for (auto & layer : vision_feature_layer) {
                hparams.vision_feature_layer.insert(layer);
            }
            // Calculate the deepest feature layer based on hparams and projector type
            ctx_clip.max_feature_layer = get_deepest_feature_layer(&ctx_clip);

            LOG_INF("%s: text_encoder:       %d\n", __func__, ctx_clip.has_text_encoder);
            LOG_INF("%s: vision_encoder:     %d\n", __func__, ctx_clip.has_vision_encoder);
            LOG_INF("%s: llava_projector:    %d\n", __func__, ctx_clip.has_llava_projector);
            LOG_INF("%s: minicpmv_projector: %d\n", __func__, ctx_clip.has_minicpmv_projector);
            LOG_INF("%s: minicpmv_version:   %d\n", __func__, ctx_clip.minicpmv_version);
            LOG_INF("%s: glm_projector:      %d\n", __func__, ctx_clip.has_glm_projector);
            LOG_INF("%s: model size:         %.2f MiB\n", __func__, model_size / 1024.0 / 1024.0);
            LOG_INF("%s: metadata size:      %.2f MiB\n", __func__, ggml_get_mem_size(ctx_meta.get()) / 1024.0 / 1024.0);
        }

        // model-specific params
        switch (ctx_clip.proj_type) {
            case PROJECTOR_TYPE_IDEFICS3:
                {
                    get_u32(KEY_PROJ_SCALE_FACTOR, hparams.proj_scale_factor, false);
                } break;
            case PROJECTOR_TYPE_PIXTRAL:
                {
                    hparams.rope_theta = 10000.0f;
                } break;
            default:
                break;
        }
    }